

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_suite.cpp
# Opt level: O0

void from_suite::fail_on_struct(void)

{
  undefined1 *this;
  bool bVar1;
  error_code *error_00;
  error_code eVar2;
  error_code local_78 [2];
  undefined1 local_58 [8];
  variable result;
  error_code error;
  any local_10;
  any any;
  
  error_00 = (error_code *)0x0;
  boost::any::any<from_suite::fail_on_struct()::record>
            (&local_10,(record *)((long)&error._M_cat + 7),(type *)0x0,(type *)0x0);
  this = &result.storage.field_0x28;
  std::error_code::error_code((error_code *)this);
  trial::dynamic::convert::into<trial::dynamic::basic_variable<std::allocator<char>>,boost::any>
            ((basic_variable<std::allocator<char>_> *)local_58,(convert *)&local_10,(any *)this,
             error_00);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                    ((basic_variable<std::allocator<char>_> *)local_58);
  boost::detail::test_impl
            ("result.is<nullable>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x134,"void from_suite::fail_on_struct()",bVar1);
  eVar2 = trial::dynamic::make_error_code(incompatible_type);
  local_78[0]._M_cat = eVar2._M_cat;
  local_78[0]._M_value = eVar2._M_value;
  bVar1 = std::operator==((error_code *)&result.storage.field_0x28,local_78);
  boost::detail::test_impl
            ("error == make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x135,"void from_suite::fail_on_struct()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_58);
  boost::any::~any(&local_10);
  return;
}

Assistant:

void fail_on_struct()
{
    struct record {};
    boost::any any(record{});
    std::error_code error;
    variable result = convert::into<variable>(any, error);
    TRIAL_PROTOCOL_TEST(result.is<nullable>());
    TRIAL_PROTOCOL_TEST(error == make_error_code(incompatible_type));
}